

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerKeepAlive.cpp
# Opt level: O0

void __thiscall
ki::protocol::control::ServerKeepAlive::read_from(ServerKeepAlive *this,istream *istream)

{
  uint32_t uVar1;
  Field<int> *pFVar2;
  ostringstream oss;
  parse_error *e;
  string local_c8 [32];
  Field<int> *local_a8;
  Field<int> *timestamp;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Record record;
  istream *istream_local;
  ServerKeepAlive *this_local;
  
  record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)istream;
  ki::dml::Record::Record((Record *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"m_session_id",&local_89);
  ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_88,true);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"m_timestamp",(allocator *)((long)&e + 7));
  pFVar2 = ki::dml::Record::add_field<int>((Record *)local_68,(string *)local_c8,true);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  local_a8 = pFVar2;
  ki::dml::Record::read_from
            ((Record *)local_68,
             (istream *)record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uVar1 = ki::dml::Field<int>::get_value(local_a8);
  this->m_timestamp = uVar1;
  ki::dml::Record::~Record((Record *)local_68);
  return;
}

Assistant:

void ServerKeepAlive::read_from(std::istream& istream)
	{
		dml::Record record;
		record.add_field<dml::USHRT>("m_session_id");
		auto *timestamp = record.add_field<dml::INT>("m_timestamp");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading ServerKeepAlive payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_timestamp = timestamp->get_value();
	}